

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

RandomNormalLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randomnormallike(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x492) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x492;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    RandomNormalLikeLayerParams::RandomNormalLikeLayerParams(this_00.randomnormallike_);
    (this->layer_).randomnormallike_ = (RandomNormalLikeLayerParams *)this_00;
  }
  return (RandomNormalLikeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomNormalLikeLayerParams* NeuralNetworkLayer::mutable_randomnormallike() {
  if (!has_randomnormallike()) {
    clear_layer();
    set_has_randomnormallike();
    layer_.randomnormallike_ = new ::CoreML::Specification::RandomNormalLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomNormalLike)
  return layer_.randomnormallike_;
}